

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O2

void __thiscall
boost::
function2<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
::function2<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
          (function2<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
           *this,token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *f,
          type_conflict3 param_2)

{
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> local_30;
  
  *(undefined8 *)this = 0;
  algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>::token_finderF
            (&local_30,f);
  assign_to<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
            (this,&local_30);
  algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_30.m_Pred);
  return;
}

Assistant:

BOOST_FUNCTION_FUNCTION(Functor BOOST_FUNCTION_TARGET_FIX(const &) f
#ifndef BOOST_NO_SFINAE
                            ,typename boost::enable_if_c<
                             !(is_integral<Functor>::value),
                                        int>::type = 0
#endif // BOOST_NO_SFINAE
                            ) :
      function_base()
    {
      this->assign_to(f);
    }